

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

void green_poller_dump(green_poller_t poller)

{
  size_t sVar1;
  green_future_t pgVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  green_future_t f;
  size_t i;
  int w;
  green_poller_t poller_local;
  
  fprintf(_stderr,"poller @ 0x%p, size=%zu, used=%zu, busy=%zu:\n",poller,poller->size,poller->used,
          poller->busy);
  sVar1 = poller->size;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = log10((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  dVar4 = ceil(dVar4);
  uVar3 = (uint)dVar4;
  for (f = (green_future_t)0x0; f < (green_future_t)poller->size;
      f = (green_future_t)((long)&f->loop + 1)) {
    pgVar2 = poller->futures[(long)f];
    if (f == (green_future_t)0x0) {
      fprintf(_stderr,"  --busy--\n");
    }
    if (f == (green_future_t)poller->busy) {
      fprintf(_stderr,"  --done--\n");
    }
    if (f == (green_future_t)poller->used) {
      fprintf(_stderr,"  --free--\n");
    }
    if (pgVar2 == (green_future_t)0x0) {
      fprintf(_stderr,"  %*zu => null\n",(ulong)uVar3,f);
    }
    else {
      fprintf(_stderr,"  %*zu => (%*d) %p (%s)\n",(ulong)uVar3,f,(ulong)uVar3,
              (ulong)(uint)pgVar2->slot,pgVar2,green_poller_dump::states[pgVar2->state]);
    }
  }
  fprintf(_stderr,"  --------\n");
  return;
}

Assistant:

static void green_poller_dump(green_poller_t poller)
{
    static const char* states[] = {
        "pending",
        "aborted",
        "complete",
    };
    fprintf(stderr, "poller @ 0x%p, size=%zu, used=%zu, busy=%zu:\n",
            poller, poller->size, poller->used, poller->busy);
    int w = (int)ceil(log10((double)poller->size));
    for (size_t i = 0; (i < poller->size); ++i) {
        green_future_t f = poller->futures[i];
        if (i == 0) {
            fprintf(stderr, "  --busy--\n");
        }
        if (i == poller->busy) {
            fprintf(stderr, "  --done--\n");
        }
        if (i == poller->used) {
            fprintf(stderr, "  --free--\n");
        }
        if (f) {
            fprintf(stderr, "  %*zu => (%*d) %p (%s)\n",
                    w, i, w, f->slot, f, states[f->state]);
        }
        else {
            fprintf(stderr, "  %*zu => null\n", w, i);
        }
    }
    fprintf(stderr, "  --------\n");
}